

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uarrsort.cpp
# Opt level: O0

void insertionSort(char *array,int32_t length,int32_t itemSize,UComparator *cmp,void *context,
                  UErrorCode *pErrorCode)

{
  void **local_110;
  void *pv;
  UAlignedMemory v [26];
  UErrorCode *pErrorCode_local;
  void *context_local;
  UComparator *cmp_local;
  int32_t itemSize_local;
  int32_t length_local;
  char *array_local;
  
  if (itemSize < 0xc9) {
    local_110 = &pv;
  }
  else {
    local_110 = (void **)uprv_malloc_63((long)itemSize);
    if (local_110 == (void **)0x0) {
      *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
      return;
    }
  }
  doInsertionSort(array,length,itemSize,cmp,context,local_110);
  if (local_110 != &pv) {
    uprv_free_63(local_110);
  }
  return;
}

Assistant:

static void
insertionSort(char *array, int32_t length, int32_t itemSize,
              UComparator *cmp, const void *context, UErrorCode *pErrorCode) {
    UAlignedMemory v[STACK_ITEM_SIZE/sizeof(UAlignedMemory)+1];
    void *pv;

    /* allocate an intermediate item variable (v) */
    if(itemSize<=STACK_ITEM_SIZE) {
        pv=v;
    } else {
        pv=uprv_malloc(itemSize);
        if(pv==NULL) {
            *pErrorCode=U_MEMORY_ALLOCATION_ERROR;
            return;
        }
    }

    doInsertionSort(array, length, itemSize, cmp, context, pv);

    if(pv!=v) {
        uprv_free(pv);
    }
}